

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_cpio_newc.c
# Opt level: O2

int is_hex(char *p,size_t len)

{
  size_t sVar1;
  uint uVar2;
  
  sVar1 = 0;
  do {
    if (len == sVar1) {
      return 1;
    }
    if (9 < (byte)(p[sVar1] - 0x30U)) {
      uVar2 = (byte)p[sVar1] - 0x41;
      if (0x25 < uVar2) {
        return 0;
      }
      if ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        return 0;
      }
    }
    sVar1 = sVar1 + 1;
  } while( true );
}

Assistant:

static int
is_hex(const char *p, size_t l)
{
	while (l > 0) {
		if (*p >= '0' && *p <= '9') {
			/* Ascii digit */
		} else if (*p >= 'a' && *p <= 'f') {
			/* lowercase letter a-f */
		} else {
			/* Not hex. */
			return (0);
		}
		--l;
		++p;
	}
	return (1);
}